

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

void jsonip::detail::stl_pushbackable_helper<std::vector<int,std::allocator<int>>>::
     write<jsonip::writer<true>>(writer<true> *w,vector<int,_std::allocator<int>_> *t)

{
  int *piVar1;
  
  writer<true>::array_start(w);
  for (piVar1 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
      piVar1 != (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish; piVar1 = piVar1 + 1) {
    arithmetic_helper<int>::write<jsonip::writer<true>>(w,*piVar1);
  }
  writer<true>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }